

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

int loadArgs(int argc,char **argv,Settings *s,Transformation *t,string *fjson)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  double dVar5;
  exception *e;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string str;
  int i;
  string *fjson_local;
  Transformation *t_local;
  Settings *s_local;
  char **argv_local;
  int argc_local;
  
  t->enable = false;
  s->stat = false;
  if (argc < 2) {
    argv_local._4_4_ = usage();
  }
  else {
    str.field_2._12_4_ = 0;
    while ((int)str.field_2._12_4_ < argc + -1) {
      lVar4 = (long)(int)str.field_2._12_4_;
      str.field_2._12_4_ = str.field_2._12_4_ + 1;
      pcVar1 = argv[lVar4 + 1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar1,&local_59);
      std::allocator<char>::~allocator(&local_59);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"-t");
      if (bVar2) {
        t->enable = true;
        lVar4 = (long)(int)str.field_2._12_4_;
        str.field_2._12_4_ = str.field_2._12_4_ + 1;
        std::__cxx11::string::operator=((string *)&t->outdir,argv[lVar4 + 1]);
        poVar3 = std::operator<<((ostream *)&std::cout,"Transformation directory = \"");
        poVar3 = std::operator<<(poVar3,(string *)&t->outdir);
        std::operator<<(poVar3,"\".\n");
        lVar4 = (long)(int)str.field_2._12_4_;
        str.field_2._12_4_ = str.field_2._12_4_ + 1;
        pcVar1 = argv[lVar4 + 1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar1,&local_91);
        dVar5 = std::__cxx11::stod(&local_90,(size_t *)0x0);
        t->x = dVar5;
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        lVar4 = (long)(int)str.field_2._12_4_;
        str.field_2._12_4_ = str.field_2._12_4_ + 1;
        pcVar1 = argv[lVar4 + 1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
        dVar5 = std::__cxx11::stod(&local_b8,(size_t *)0x0);
        t->y = dVar5;
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        lVar4 = (long)(int)str.field_2._12_4_;
        str.field_2._12_4_ = str.field_2._12_4_ + 1;
        pcVar1 = argv[lVar4 + 1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,pcVar1,(allocator<char> *)((long)&e + 7));
        dVar5 = std::__cxx11::stod(&local_e0,(size_t *)0x0);
        t->rot = dVar5;
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
        poVar3 = std::operator<<((ostream *)&std::cout,"X translation = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,t->x);
        std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<((ostream *)&std::cout,"Y translation = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,t->y);
        std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<((ostream *)&std::cout,"Rotation      = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,t->rot);
        std::operator<<(poVar3,"\n");
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"-s");
        if (bVar2) {
          s->stat = true;
        }
        else {
          std::__cxx11::string::operator=((string *)fjson,(string *)local_58);
        }
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int loadArgs(int argc, char* argv[], Settings& s, Transformation& t, std::string& fjson)
{
	t.enable = false;
	s.stat = false;

	if (argc < 2)
	{
		return usage();
	}

	int i = 0;
	while (i < argc - 1)
	{
		try
		{
			std::string str = argv[++i];
			if (str == "-t")
			{
				// Transformation args
				t.enable = true;
				t.outdir = argv[++i];
				std::cout << "Transformation directory = \"" << t.outdir << "\".\n";
				t.x   = std::stod(argv[++i]);
				t.y   = std::stod(argv[++i]);
				t.rot = std::stod(argv[++i]);
				std::cout << "X translation = " << t.x   << "\n";
				std::cout << "Y translation = " << t.y   << "\n";
				std::cout << "Rotation      = " << t.rot << "\n";
				std::cout << std::endl;
			}
			else if (str == "-s")
			{
				// Summary statistics
				s.stat = true;
			}
			else
				fjson = str;
		}
		catch (const std::exception& e)
		{
			std::cout << e.what() << std::endl;
			return usage();
		}
	}
	return 0;
}